

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ViconCGStreamClient.cpp
# Opt level: O0

void __thiscall VViconCGStreamClient::SetStreaming(VViconCGStreamClient *this,bool i_bStreaming)

{
  bool bVar1;
  undefined1 local_b8 [8];
  VRequestFrame RequestFrame;
  VScopedWriter Objects;
  shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  local_88;
  undefined1 local_78 [8];
  VCGStreamReaderWriter ReaderWriter;
  undefined1 local_28 [8];
  scoped_lock Lock;
  bool i_bStreaming_local;
  VViconCGStreamClient *this_local;
  
  Lock._15_1_ = i_bStreaming;
  boost::unique_lock<boost::recursive_mutex>::unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_28,&this->m_Mutex);
  bVar1 = (this->m_bStreaming & 1U) != (Lock._15_1_ & 1);
  if (bVar1) {
    this->m_bStreaming = (bool)(Lock._15_1_ & 1);
    std::
    shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
    ::shared_ptr(&local_88,&this->m_pSocket);
    VCGStreamReaderWriter::VCGStreamReaderWriter((VCGStreamReaderWriter *)local_78,&local_88);
    std::
    shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
    ::~shared_ptr(&local_88);
    ViconCGStreamIO::VScopedWriter::VScopedWriter
              ((VScopedWriter *)&RequestFrame.m_bStreaming,(VBuffer *)local_78,0x1a2b0001);
    ViconCGStream::VRequestFrame::VRequestFrame((VRequestFrame *)local_b8);
    RequestFrame.super_VItem._vptr_VItem._0_1_ = this->m_bStreaming & 1;
    ViconCGStreamIO::VScopedWriter::Write
              ((VScopedWriter *)&RequestFrame.m_bStreaming,(VItem *)local_b8);
    ViconCGStream::VRequestFrame::~VRequestFrame((VRequestFrame *)local_b8);
    ViconCGStreamIO::VScopedWriter::~VScopedWriter((VScopedWriter *)&RequestFrame.m_bStreaming);
    VCGStreamReaderWriter::Flush((VCGStreamReaderWriter *)local_78);
    VCGStreamReaderWriter::~VCGStreamReaderWriter((VCGStreamReaderWriter *)local_78);
  }
  ReaderWriter.m_pMulticastSocket.
  super___shared_ptr<boost::asio::basic_datagram_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._5_3_ = 0;
  ReaderWriter.m_pMulticastSocket.
  super___shared_ptr<boost::asio::basic_datagram_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_1_ = !bVar1;
  boost::unique_lock<boost::recursive_mutex>::~unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_28);
  return;
}

Assistant:

void VViconCGStreamClient::SetStreaming( bool i_bStreaming )
{
  boost::recursive_mutex::scoped_lock Lock( m_Mutex );

  if( m_bStreaming == i_bStreaming )
  {
    return;
  }

  m_bStreaming = i_bStreaming;

  VCGStreamReaderWriter ReaderWriter( m_pSocket );
  {
    ViconCGStreamIO::VScopedWriter Objects( ReaderWriter );
    ViconCGStream::VRequestFrame RequestFrame;
    RequestFrame.m_bStreaming = m_bStreaming;
    Objects.Write( RequestFrame );
  }
  ReaderWriter.Flush();
}